

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::ConstantFilter::ToString
          (string *__return_storage_ptr__,ConstantFilter *this,string *column_name)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ExpressionTypeToOperator_abi_cxx11_
            (&local_40,(duckdb *)(ulong)(byte)(this->super_TableFilter).field_0x9,
             (ExpressionType)column_name);
  ::std::operator+(&local_60,column_name,&local_40);
  Value::ToSQLString_abi_cxx11_(&local_80,&this->constant);
  ::std::operator+(__return_storage_ptr__,&local_60,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string ConstantFilter::ToString(const string &column_name) const {
	return column_name + ExpressionTypeToOperator(comparison_type) + constant.ToSQLString();
}